

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_7fba::test_art_iterator_erase(void **param_1)

{
  unsigned_long uVar1;
  pointer pVVar2;
  pointer pVVar3;
  art_val_t *paVar4;
  art_val_t *paVar5;
  pointer pVVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  size_t j;
  ulong uVar9;
  long lVar10;
  initializer_list<unsigned_long> __l;
  art_t art;
  vector<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_> keys;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  art_iterator_t iterator;
  
  keys.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  values.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keys.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keys.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  values.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iterator.depth = '\x10';
  iterator.frame = '\0';
  iterator._18_6_ = 0;
  iterator.frames[0].node = (art_node_t *)0x30;
  iterator.key[0] = '\x01';
  iterator.key[1] = '\0';
  iterator.key[2] = '\0';
  iterator.key[3] = '\0';
  iterator.key[4] = '\0';
  iterator.key[5] = '\0';
  iterator._6_2_ = 0;
  iterator.value = (art_val_t *)0x4;
  iterator.frames[0].index_in_node = '\0';
  iterator.frames[0]._9_7_ = 1;
  __l._M_len = 5;
  __l._M_array = (iterator)&iterator;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&sizes,__l,(allocator_type *)&art);
  for (uVar7 = 0;
      pVVar2 = values.
               super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    uVar1 = sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7];
    paVar5 = (art_val_t *)0x0;
    for (uVar9 = 0; (byte)uVar1 != uVar9; uVar9 = uVar9 + 1) {
      iterator.key = (art_key_chunk_t  [6])((uint6)CONCAT11((char)uVar9,(char)uVar7) << 0x18);
      std::vector<std::array<unsigned_char,6ul>,std::allocator<std::array<unsigned_char,6ul>>>::
      emplace_back<std::array<unsigned_char,6ul>>
                ((vector<std::array<unsigned_char,6ul>,std::allocator<std::array<unsigned_char,6ul>>>
                  *)&keys,(array<unsigned_char,_6UL> *)&iterator);
      iterator.value = paVar5;
      std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
      push_back(&values,(value_type *)&iterator);
      paVar5 = (art_val_t *)((long)paVar5->key + uVar7);
    }
  }
  art.root = (art_node_t *)0x0;
  lVar10 = 0;
  pVVar6 = values.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)keys.
                             super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.
                            super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 6); uVar7 = uVar7 + 1) {
    art_insert((art_t *)&art,
               (keys.
                super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar10,(art_val_t *)pVVar6);
    assert_art_valid(&art);
    pVVar6 = pVVar6 + 1;
    lVar10 = lVar10 + 6;
  }
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&art,true);
  lVar8 = 0;
  lVar10 = 0;
  pVVar6 = pVVar2;
  do {
    assert_key_eq((art_key_chunk_t *)&iterator,
                  (keys.
                   super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8);
    _assert_true((ulong)(pVVar6 == (pointer)iterator.value),"iterator.value == &values[i]",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                 ,0x21c);
    pVVar3 = (pointer)art_iterator_erase((art_t *)&art,(art_iterator_t *)&iterator);
    _assert_true((ulong)(pVVar6 == pVVar3),"art_iterator_erase(&art, &iterator) == &values[i]",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                 ,0x21d);
    assert_art_valid(&art);
    paVar4 = art_find((art_t *)&art,
                      (keys.
                       super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8);
    _assert_true((ulong)(paVar4 == (art_val_t *)0x0),
                 "art_find(&art, (art_key_chunk_t*)keys[i].data())",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                 ,0x21f);
    lVar10 = lVar10 + 1;
    lVar8 = lVar8 + 6;
    pVVar6 = pVVar6 + 1;
  } while (iterator.value != (art_val_t *)0x0);
  _assert_true((ulong)((long)values.
                             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4 ==
                      lVar10),"i == values.size()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x222);
  art_free((art_t *)&art);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
  ~_Vector_base(&values.
                 super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
               );
  std::
  _Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>::
  ~_Vector_base(&keys.
                 super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
               );
  return;
}

Assistant:

void erase(Key key) {
        art_erase(&art_, key.data());
        shadow_.erase(key);
    }